

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O3

void __thiscall QMakeParser::finalizeTest(QMakeParser *this,ushort **tokPtr)

{
  int iVar1;
  ushort *puVar2;
  ushort uVar3;
  
  flushScopes(this,tokPtr);
  iVar1 = this->m_markLine;
  if (iVar1 != 0) {
    puVar2 = *tokPtr;
    *puVar2 = 1;
    *tokPtr = puVar2 + 2;
    puVar2[1] = (ushort)iVar1;
    this->m_markLine = 0;
  }
  if (this->m_operator == OrOperator) {
    uVar3 = 0x17;
LAB_00293b3b:
    puVar2 = *tokPtr;
    *tokPtr = puVar2 + 1;
    *puVar2 = uVar3;
  }
  else {
    if (this->m_operator != AndOperator) goto LAB_00293b4f;
    uVar3 = 0x16;
    if (this->m_state == StCond) goto LAB_00293b3b;
  }
  this->m_operator = NoOperator;
LAB_00293b4f:
  if ((this->m_invert & 1) != 0) {
    puVar2 = *tokPtr;
    *tokPtr = puVar2 + 1;
    *puVar2 = 0x15;
  }
  this->m_invert = 0;
  this->m_state = StCond;
  this->m_canElse = true;
  return;
}

Assistant:

void QMakeParser::finalizeTest(ushort *&tokPtr)
{
    flushScopes(tokPtr);
    putLineMarker(tokPtr);
    putOperator(tokPtr);
    if (m_invert & 1)
        putTok(tokPtr, TokNot);
    m_invert = 0;
    m_state = StCond;
    m_canElse = true;
}